

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

void __thiscall
cmsys::RegularExpression::RegularExpression(RegularExpression *this,RegularExpression *rxp)

{
  char *pcVar1;
  ulong uVar2;
  
  if (rxp->program == (char *)0x0) {
    this->program = (char *)0x0;
  }
  else {
    uVar2 = (ulong)rxp->progsize;
    this->progsize = rxp->progsize;
    pcVar1 = (char *)operator_new__(uVar2);
    this->program = pcVar1;
    for (; uVar2 != 0; uVar2 = uVar2 - 1) {
      this->program[uVar2 - 1] = rxp->program[uVar2 - 1];
    }
    this->startp[0] = rxp->startp[0];
    this->endp[0] = rxp->endp[0];
    pcVar1 = rxp->regmust;
    this->regmust = pcVar1;
    if (pcVar1 != (char *)0x0) {
      uVar2 = 0;
      if (rxp->program != pcVar1) {
        uVar2 = (ulong)(uint)((int)pcVar1 - (int)rxp->program);
      }
      this->regmust = this->program + uVar2;
    }
    this->regstart = rxp->regstart;
    this->reganch = rxp->reganch;
    this->regmlen = rxp->regmlen;
  }
  return;
}

Assistant:

RegularExpression::RegularExpression (const RegularExpression& rxp) {
  if ( !rxp.program )
    {
    this->program = 0;
    return;
    }
  int ind;
  this->progsize = rxp.progsize;                // Copy regular expression size
  this->program = new char[this->progsize];     // Allocate storage
  for(ind=this->progsize; ind-- != 0;)          // Copy regular expresion
    this->program[ind] = rxp.program[ind];
  this->startp[0] = rxp.startp[0];              // Copy pointers into last
  this->endp[0] = rxp.endp[0];                  // Successful "find" operation
  this->regmust = rxp.regmust;                  // Copy field
  if (rxp.regmust != 0) {
    char* dum = rxp.program;
    ind = 0;
    while (dum != rxp.regmust) {
      ++dum;
      ++ind;
    }
    this->regmust = this->program + ind;
  }
  this->regstart = rxp.regstart;                // Copy starting index
  this->reganch = rxp.reganch;                  // Copy remaining private data
  this->regmlen = rxp.regmlen;                  // Copy remaining private data
}